

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

PixelFormat
deqp::egl::anon_unknown_4::getPixelFormat(Library *egl,EGLDisplay display,EGLConfig config)

{
  PixelFormat PVar1;
  EGLint EVar2;
  EGLConfig config_local;
  EGLDisplay display_local;
  Library *egl_local;
  PixelFormat fmt;
  
  tcu::PixelFormat::PixelFormat((PixelFormat *)&egl_local);
  egl_local._0_4_ = eglu::getConfigAttribInt(egl,display,config,0x3024);
  egl_local._4_4_ = eglu::getConfigAttribInt(egl,display,config,0x3023);
  fmt.redBits = eglu::getConfigAttribInt(egl,display,config,0x3022);
  EVar2 = eglu::getConfigAttribInt(egl,display,config,0x3021);
  PVar1.greenBits = egl_local._4_4_;
  PVar1.redBits = (EGLint)egl_local;
  PVar1.blueBits = fmt.redBits;
  PVar1.alphaBits = EVar2;
  return PVar1;
}

Assistant:

tcu::PixelFormat getPixelFormat (const Library& egl, EGLDisplay display, EGLConfig config)
{
	tcu::PixelFormat fmt;
	fmt.redBits		= eglu::getConfigAttribInt(egl, display, config, EGL_RED_SIZE);
	fmt.greenBits	= eglu::getConfigAttribInt(egl, display, config, EGL_GREEN_SIZE);
	fmt.blueBits	= eglu::getConfigAttribInt(egl, display, config, EGL_BLUE_SIZE);
	fmt.alphaBits	= eglu::getConfigAttribInt(egl, display, config, EGL_ALPHA_SIZE);
	return fmt;
}